

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86.cpp
# Opt level: O2

int __thiscall ncnn::ReLU_x86::forward_inplace_int8(ReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  iVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  uVar1 = bottom_top_blob->c;
  if (bottom_top_blob->elempack == 8) {
    if (*(float *)(&this->field_0xd0 + (long)this->_vptr_ReLU_x86[-3]) == 0.0) {
      uVar5 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar5;
      }
      for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
        pvVar2 = bottom_top_blob->data;
        lVar6 = bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar5;
        for (lVar7 = 0; iVar3 != (int)lVar7; lVar7 = lVar7 + 1) {
          if (*(char *)((long)pvVar2 + lVar7 * 8 + lVar6) < '\0') {
            *(undefined1 *)((long)pvVar2 + lVar7 * 8 + lVar6) = 0;
          }
          if (*(char *)((long)pvVar2 + lVar7 * 8 + lVar6 + 1) < '\0') {
            *(undefined1 *)((long)pvVar2 + lVar7 * 8 + lVar6 + 1) = 0;
          }
          if (*(char *)((long)pvVar2 + lVar7 * 8 + lVar6 + 2) < '\0') {
            *(undefined1 *)((long)pvVar2 + lVar7 * 8 + lVar6 + 2) = 0;
          }
          if (*(char *)((long)pvVar2 + lVar7 * 8 + lVar6 + 3) < '\0') {
            *(undefined1 *)((long)pvVar2 + lVar7 * 8 + lVar6 + 3) = 0;
          }
          if (*(char *)((long)pvVar2 + lVar7 * 8 + lVar6 + 4) < '\0') {
            *(undefined1 *)((long)pvVar2 + lVar7 * 8 + lVar6 + 4) = 0;
          }
          if (*(char *)((long)pvVar2 + lVar7 * 8 + lVar6 + 5) < '\0') {
            *(undefined1 *)((long)pvVar2 + lVar7 * 8 + lVar6 + 5) = 0;
          }
          if (*(char *)((long)pvVar2 + lVar7 * 8 + lVar6 + 6) < '\0') {
            *(undefined1 *)((long)pvVar2 + lVar7 * 8 + lVar6 + 6) = 0;
          }
          if (*(char *)((long)pvVar2 + lVar7 * 8 + lVar6 + 7) < '\0') {
            *(undefined1 *)((long)pvVar2 + lVar7 * 8 + lVar6 + 7) = 0;
          }
        }
      }
    }
  }
  else if (*(float *)(&this->field_0xd0 + (long)this->_vptr_ReLU_x86[-3]) == 0.0) {
    uVar5 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      lVar6 = bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar5;
      pvVar2 = bottom_top_blob->data;
      for (lVar7 = 0; iVar3 != (int)lVar7; lVar7 = lVar7 + 1) {
        if (*(char *)((long)pvVar2 + lVar7 + lVar6) < '\0') {
          *(undefined1 *)((long)pvVar2 + lVar7 + lVar6) = 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int ReLU_x86::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
    int elempack = bottom_top_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                signed char* ptr = bottom_top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    if (ptr[0] < 0)
                        ptr[0] = 0;
                    if (ptr[1] < 0)
                        ptr[1] = 0;
                    if (ptr[2] < 0)
                        ptr[2] = 0;
                    if (ptr[3] < 0)
                        ptr[3] = 0;
                    if (ptr[4] < 0)
                        ptr[4] = 0;
                    if (ptr[5] < 0)
                        ptr[5] = 0;
                    if (ptr[6] < 0)
                        ptr[6] = 0;
                    if (ptr[7] < 0)
                        ptr[7] = 0;

                    ptr += 8;
                }
            }
        }
        else
        {
            // TODO leakyrelu
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            signed char* ptr = bottom_top_blob.channel(q);

            int i = 0;
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr = 0;

                ptr++;
            }
        }
    }
    else
    {
        // TODO leakyrelu
    }

    return 0;
}